

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool medit_desc(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *in_RSI;
  char *in_RDI;
  MOB_INDEX_DATA *pMob;
  char **in_stack_ffffffffffffffd8;
  bool local_1;
  
  local_1 = *(char *)&in_RSI->next != '\0';
  if (local_1) {
    send_to_char(in_RDI,in_RSI);
  }
  else {
    string_append(*(CHAR_DATA **)(*(long *)(in_RDI + 0x80) + 0x6c60),in_stack_ffffffffffffffd8);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool medit_desc(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;

	EDIT_MOB(ch, pMob);

	if (argument[0] == '\0')
	{
		string_append(ch, &pMob->description);
		return true;
	}

	send_to_char("Syntax:  desc    - line edit\n\r", ch);
	return false;
}